

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

char * nsvg__parseNumber(char *s,char *it,int size)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  
  bVar3 = *s;
  if ((bVar3 == 0x2d) || (iVar2 = 0, bVar3 == 0x2b)) {
    *it = bVar3;
    bVar3 = s[1];
    s = s + 1;
    iVar2 = 1;
  }
  while (pbVar1 = (byte *)s, bVar3 != 0) {
    pbVar1 = (byte *)s + 1;
    if ((byte)(bVar3 - 0x3a) < 0xf6) {
      if (bVar3 != 0x2e) goto LAB_00116595;
      if (iVar2 < 0x3f) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        it[lVar4] = '.';
      }
      bVar3 = *pbVar1;
      goto LAB_00116570;
    }
    if (iVar2 < 0x3f) {
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + 1;
      it[lVar4] = bVar3;
    }
    s = (char *)pbVar1;
    bVar3 = *pbVar1;
  }
LAB_001165d1:
  it[iVar2] = '\0';
  return (char *)pbVar1;
LAB_00116570:
  if (bVar3 == 0) goto LAB_001165d1;
  s = (char *)pbVar1;
  if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_00116595;
  if (iVar2 < 0x3f) {
    lVar4 = (long)iVar2;
    iVar2 = iVar2 + 1;
    it[lVar4] = bVar3;
  }
  bVar3 = pbVar1[1];
  pbVar1 = pbVar1 + 1;
  goto LAB_00116570;
LAB_00116595:
  pbVar1 = (byte *)s;
  if ((bVar3 | 0x20) == 0x65) {
    if (iVar2 < 0x3f) {
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + 1;
      it[lVar4] = bVar3;
    }
    bVar3 = pbVar1[1];
    if ((bVar3 != 0x2d) && (bVar3 != 0x2b)) goto LAB_001165d9;
    if (iVar2 < 0x3f) {
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + 1;
      it[lVar4] = bVar3;
    }
    bVar3 = pbVar1[2];
    pbVar1 = pbVar1 + 2;
    while (0xf5 < (byte)(bVar3 - 0x3a)) {
      if (iVar2 < 0x3f) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        it[lVar4] = bVar3;
      }
      bVar3 = pbVar1[1];
LAB_001165d9:
      pbVar1 = pbVar1 + 1;
    }
  }
  goto LAB_001165d1;
}

Assistant:

static const char* nsvg__parseNumber(const char* s, char* it, const int size)
{
	const int last = size-1;
	int i = 0;

	// sign
	if (*s == '-' || *s == '+') {
		if (i < last) it[i++] = *s;
		s++;
	}
	// integer part
	while (*s && nsvg__isdigit(*s)) {
		if (i < last) it[i++] = *s;
		s++;
	}
	if (*s == '.') {
		// decimal point
		if (i < last) it[i++] = *s;
		s++;
		// fraction part
		while (*s && nsvg__isdigit(*s)) {
			if (i < last) it[i++] = *s;
			s++;
		}
	}
	// exponent
	if (*s == 'e' || *s == 'E') {
		if (i < last) it[i++] = *s;
		s++;
		if (*s == '-' || *s == '+') {
			if (i < last) it[i++] = *s;
			s++;
		}
		while (*s && nsvg__isdigit(*s)) {
			if (i < last) it[i++] = *s;
			s++;
		}
	}
	it[i] = '\0';

	return s;
}